

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

void __thiscall mp::PLPoints::PLPoints(PLPoints *this,PLSlopes *pls)

{
  double dVar1;
  double dVar2;
  double dVar3;
  longdouble lVar4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __result;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  vector<double,_std::allocator<double>_> *this_00;
  size_type __n;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  PLSlopes *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar8;
  double dVar9;
  size_t i_1;
  size_t i;
  longdouble deltaH;
  SmallVec<long_double,_32> YL;
  double Y0;
  double X0;
  size_type nsl;
  vector<double,_std::allocator<double>_> *sl;
  vector<double,_std::allocator<double>_> *bp;
  double eps;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc28;
  small_vector<long_double,_32U,_std::allocator<long_double>_> *in_stack_fffffffffffffc30;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffc38;
  undefined4 local_3bc;
  undefined6 in_stack_fffffffffffffc48;
  undefined6 uVar10;
  undefined2 in_stack_fffffffffffffc4e;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffc50;
  undefined8 uVar11;
  undefined2 in_stack_fffffffffffffc58;
  undefined2 uVar12;
  undefined2 in_stack_fffffffffffffc5a;
  undefined4 in_stack_fffffffffffffc5c;
  undefined4 uVar13;
  undefined6 uStack_3a0;
  size_type local_2c8;
  ulong local_2c0;
  longdouble local_2b8;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x524c67);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x524c80);
  PLSlopes::GetBP(in_RSI);
  this_00 = PLSlopes::GetSlopes(in_RSI);
  __n = std::vector<double,_std::allocator<double>_>::size(this_00);
  dVar8 = PLSlopes::GetX0(in_RSI);
  dVar9 = PLSlopes::GetY0(in_RSI);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50._M_current,
             CONCAT26(in_stack_fffffffffffffc4e,in_stack_fffffffffffffc48));
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc50._M_current,
             CONCAT26(in_stack_fffffffffffffc4e,in_stack_fffffffffffffc48));
  std::allocator<long_double>::allocator((allocator<long_double> *)0x524da9);
  gch::small_vector<long_double,_32U,_std::allocator<long_double>_>::small_vector
            (in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28,
             (allocator_type *)0x524dc6);
  std::allocator<long_double>::~allocator((allocator<long_double> *)0x524dd5);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc28);
  std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffc28);
  std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffc28);
  __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
            (in_stack_fffffffffffffc38,(difference_type)in_stack_fffffffffffffc30);
  __first._M_current._2_2_ = in_stack_fffffffffffffc5a;
  __first._M_current._0_2_ = in_stack_fffffffffffffc58;
  __first._M_current._4_4_ = in_stack_fffffffffffffc5c;
  __result._M_current._6_2_ = in_stack_fffffffffffffc4e;
  __result._M_current._0_6_ = in_stack_fffffffffffffc48;
  std::
  copy<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (__first,in_stack_fffffffffffffc50,__result);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
  dVar1 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  *pvVar5 = dVar1 - 1.0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,__n - 1);
  dVar1 = *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,__n);
  *pvVar5 = dVar1 + 1.0;
  local_2b8 = (longdouble)0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  if (dVar8 < *pvVar5) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
    dVar1 = *pvVar6;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
    local_2b8 = (longdouble)dVar1 * ((longdouble)*pvVar5 - (longdouble)dVar8) + (longdouble)dVar9;
  }
  for (local_2c0 = 0; local_2c0 < __n; local_2c0 = local_2c0 + 1) {
    pvVar7 = gch::small_vector<long_double,_32U,_std::allocator<long_double>_>::operator[]
                       (in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
    lVar4 = *(longdouble *)pvVar7;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_2c0);
    dVar1 = *pvVar6;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_2c0 + 1);
    dVar2 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_2c0);
    dVar3 = *pvVar5;
    pvVar7 = gch::small_vector<long_double,_32U,_std::allocator<long_double>_>::operator[]
                       (in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
    *(longdouble *)pvVar7 = lVar4 + (longdouble)dVar1 * ((longdouble)dVar2 - (longdouble)dVar3);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_2c0);
    if (*pvVar5 <= dVar8) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_2c0 + 1);
      if ((dVar8 <= *pvVar5) || (local_2c0 == __n - 1)) {
        uVar13 = SUB104((longdouble)dVar9,0);
        uStack_3a0 = (undefined6)((unkuint10)(longdouble)dVar9 >> 0x20);
        pvVar7 = gch::small_vector<long_double,_32U,_std::allocator<long_double>_>::operator[]
                           (in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
        uVar11 = (undefined8)*(unkbyte10 *)pvVar7;
        uVar12 = (undefined2)((unkuint10)*(unkbyte10 *)pvVar7 >> 0x40);
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](this_00,local_2c0);
        local_3bc = SUB104((longdouble)*pvVar6,0);
        uVar10 = (undefined6)((unkuint10)(longdouble)*pvVar6 >> 0x20);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_2c0);
        local_2b8 = (longdouble)CONCAT64(uStack_3a0,uVar13) -
                    ((-(longdouble)*pvVar5 - (longdouble)dVar8) *
                     (longdouble)CONCAT64(uVar10,local_3bc) + (longdouble)CONCAT28(uVar12,uVar11));
      }
    }
  }
  for (local_2c8 = 0; local_2c8 <= __n; local_2c8 = local_2c8 + 1) {
    pvVar7 = gch::small_vector<long_double,_32U,_std::allocator<long_double>_>::operator[]
                       (in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
    in_stack_fffffffffffffc30 =
         (small_vector<long_double,_32U,_std::allocator<long_double>_> *)
         (double)(local_2b8 + *(longdouble *)pvVar7);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 1,local_2c8);
    *pvVar5 = (value_type)in_stack_fffffffffffffc30;
  }
  gch::small_vector<long_double,_32U,_std::allocator<long_double>_>::~small_vector
            ((small_vector<long_double,_32U,_std::allocator<long_double>_> *)0x52529c);
  return;
}

Assistant:

PLPoints::PLPoints(const PLSlopes &pls) {
  constexpr auto eps = 1.0;           // works?
  const auto& bp = pls.GetBP();
  const auto& sl = pls.GetSlopes();
  const auto nsl = sl.size();
  const auto X0 = pls.GetX0(), Y0 = pls.GetY0();
  x_.resize(nsl+1);
  y_.resize(nsl+1);
  SmallVec<long double, 32> YL(nsl+1);   // leftmost point: YL[0]=0
  /// Copy and add dummy breakpoints on both ends
  std::copy(bp.begin(), bp.end(), x_.begin()+1);
  x_[0] = x_[1] - eps;
  x_[nsl] = x_[nsl-1] + eps;
  /// Lift the line by this
  long double deltaH {};
  if (x_[0] > X0)                     // if left x > reference point
    deltaH = ((long double)sl[0])
                 * ((long double)x_[0]-X0) + Y0;
  for (size_t i = 0; i < nsl; ++i) {
    assert( x_[i+1] > x_[i] );
    YL[i+1] = YL[i] + sl[i] * ((long double)x_[i+1]-x_[i]);
    if (x_[i]<=X0 && (x_[i+1]>=X0 || i==nsl-1))
      deltaH = Y0 - (YL[i] + sl[i]*(-(long double)x_[i]-X0));
  }
  for (size_t i = 0; i <= nsl; ++i) {
    y_[i] = YL[i] + deltaH;
  }
}